

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ManifestLoader.cpp
# Opt level: O1

void __thiscall
llbuild::ninja::ManifestLoader::ManifestLoaderImpl::evalString
          (ManifestLoaderImpl *this,void *userContext,StringRef string,raw_ostream *result,
          function<void_(void_*,_llvm::StringRef,_llvm::raw_ostream_&)> *lookup,
          function<void_(const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
          *error)

{
  byte bVar1;
  byte *__n;
  bool bVar2;
  int iVar3;
  char *pcVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *unaff_RBX;
  char *varStart;
  uint __fd;
  char *pcVar5;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar6;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar7;
  size_type sVar8;
  byte *pbVar9;
  StringRef Str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  void *local_58;
  uint local_4c;
  void *local_48;
  _Any_data *local_40;
  raw_ostream *local_38;
  byte *extraout_RDX;
  
  pbVar9 = (byte *)(((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                      *)string.Data)->_M_local_buf + string.Length);
  paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)string.Data;
  local_48 = userContext;
  local_40 = (_Any_data *)lookup;
LAB_00133f16:
  if (paVar6 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)pbVar9) {
    return;
  }
  paVar7 = paVar6;
  if (paVar6->_M_local_buf[0] == 0x24) {
    unaff_RBX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)0x0;
  }
  else {
    do {
      paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)(paVar7->_M_local_buf + 1);
      unaff_RBX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)CONCAT71((int7)((ulong)unaff_RBX >> 8),
                              paVar7 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)pbVar9);
      if (paVar7 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)pbVar9) break;
    } while (paVar7->_M_local_buf[0] != 0x24);
  }
  Str.Length = (byte *)(paVar7->_M_local_buf + -(long)paVar6);
  if (Str.Length != (byte *)0x0) {
    Str.Data = (char *)paVar6;
    llvm::raw_ostream::operator<<(result,Str);
    Str.Length = extraout_RDX;
  }
  bVar2 = true;
  if ((char)unaff_RBX == '\0') {
    paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(paVar7->_M_local_buf + 1);
    if (paVar6 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)pbVar9) {
      pcVar5 = "invalid \'$\'-escape at end of string";
      pcVar4 = "";
LAB_001340bc:
      unaff_RBX = &local_78.field_2;
      local_78._M_dataplus._M_p = (pointer)unaff_RBX;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_78,pcVar5,pcVar4);
      if ((error->super__Function_base)._M_manager == (_Manager_type)0x0) {
LAB_00134277:
        std::__throw_bad_function_call();
      }
      (*error->_M_invoker)((_Any_data *)error,&local_78);
      paVar7 = paVar6;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != unaff_RBX) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
    }
    else {
      bVar1 = paVar6->_M_local_buf[0];
      __fd = (uint)bVar1;
      if (bVar1 < 0x24) {
        if (bVar1 == 10) {
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar7->_M_local_buf + 2);
          if (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)pbVar9) {
            do {
              iVar3 = isspace((int)paVar7->_M_local_buf[0]);
              if (iVar3 == 0) goto LAB_00134241;
              paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(paVar7->_M_local_buf + 1);
              bVar2 = false;
            } while (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                *)pbVar9);
            goto LAB_001341e9;
          }
        }
        else {
          if (__fd == 0x20) goto LAB_00134103;
LAB_0013415b:
          if ((((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
              (__fd != 0x5f)) && (bVar1 != 0x2d)) {
            pcVar5 = "invalid \'$\'-escape (literal \'$\' should be written as \'$$\')";
            pcVar4 = "";
            goto LAB_001340bc;
          }
          for (paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(paVar7->_M_local_buf + 2);
              (paVar7 != (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                          *)pbVar9 &&
              (((bVar1 = paVar7->_M_local_buf[0], (byte)(bVar1 - 0x30) < 10 ||
                ((byte)((bVar1 & 0xdf) + 0xbf) < 0x1a)) || ((bVar1 == 0x5f || (bVar1 == 0x2d))))));
              paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                        *)(paVar7->_M_local_buf + 1)) {
          }
          local_78._M_string_length = (long)paVar7 - (long)paVar6;
          local_58 = local_48;
          local_78._M_dataplus._M_p = (pointer)paVar6;
          if (*(long *)(local_40 + 1) == 0) goto LAB_00134277;
          (**(code **)(local_40->_M_pod_data + 0x18))
                    (local_40,&local_58,(StringRef *)&local_78,result);
        }
      }
      else if ((__fd == 0x24) || (bVar1 == 0x3a)) {
LAB_00134103:
        __n = (byte *)result->OutBufCur;
        if (__n < result->OutBufEnd) {
          result->OutBufCur = (char *)(__n + 1);
          *__n = bVar1;
        }
        else {
          llvm::raw_ostream::write(result,__fd,Str.Length,(size_t)__n);
        }
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar7->_M_local_buf + 2);
      }
      else {
        if (bVar1 != 0x7b) goto LAB_0013415b;
        paVar6 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar7->_M_local_buf + 2);
        unaff_RBX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)CONCAT71((int7)((ulong)unaff_RBX >> 8),1);
        sVar8 = 0;
        local_38 = result;
        do {
          paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    *)(paVar6->_M_local_buf + sVar8);
          if (paVar7 == (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)pbVar9) {
            unaff_RBX = &local_78.field_2;
            local_78._M_dataplus._M_p = (pointer)unaff_RBX;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_78,
                       "invalid variable reference in string (missing trailing \'}\')","");
            if ((error->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00134277;
            (*error->_M_invoker)((_Any_data *)error,&local_78);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_78._M_dataplus._M_p != unaff_RBX) {
              operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
            }
            goto LAB_00134241;
          }
          bVar1 = paVar7->_M_local_buf[0];
          if (bVar1 == 0x7d) {
            if (((ulong)unaff_RBX & 1) == 0) {
              local_4c = (uint)unaff_RBX;
              local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_78,"invalid variable name in reference","");
              if ((error->super__Function_base)._M_manager == (_Manager_type)0x0) goto LAB_00134277;
              (*error->_M_invoker)((_Any_data *)error,&local_78);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_78._M_dataplus._M_p != &local_78.field_2) {
                operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1
                               );
              }
              unaff_RBX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)(ulong)local_4c;
              result = local_38;
            }
            else {
              local_58 = local_48;
              local_78._M_dataplus._M_p = (pointer)paVar6;
              local_78._M_string_length = sVar8;
              if (*(long *)(local_40 + 1) == 0) goto LAB_00134277;
              (**(code **)(local_40->_M_pod_data + 0x18))
                        (local_40,&local_58,(StringRef *)&local_78,result);
            }
          }
          else if (((9 < (byte)(bVar1 - 0x30)) && (0x19 < (byte)((bVar1 & 0xdf) + 0xbf))) &&
                  ((0x32 < bVar1 - 0x2d ||
                   ((0x4000000000003U >> ((ulong)(bVar1 - 0x2d) & 0x3f) & 1) == 0)))) {
            unaff_RBX = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)0x0;
          }
          sVar8 = sVar8 + 1;
        } while (bVar1 != 0x7d);
        paVar7 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)(paVar6->_M_local_buf + sVar8);
      }
      bVar2 = false;
    }
  }
  goto LAB_001341e9;
LAB_00134241:
  bVar2 = false;
LAB_001341e9:
  paVar6 = paVar7;
  if (bVar2) {
    return;
  }
  goto LAB_00133f16;
}

Assistant:

void evalString(void* userContext, StringRef string, raw_ostream& result,
                  std::function<void(void*, StringRef, raw_ostream&)> lookup,
                  std::function<void(const std::string&)> error) {
    // Scan the string for escape sequences or variable references, accumulating
    // output pieces as we go.
    const char* pos = string.begin();
    const char* end = string.end();
    while (pos != end) {
      // Find the next '$'.
      const char* pieceStart = pos;
      for (; pos != end; ++pos) {
        if (*pos == '$')
          break;
      }

      // Add the current piece, if non-empty.
      if (pos != pieceStart)
        result << StringRef(pieceStart, pos - pieceStart);

      // If we are at the end, we are done.
      if (pos == end)
        break;

      // Otherwise, we have a '$' character to handle.
      ++pos;
      if (pos == end) {
        error("invalid '$'-escape at end of string");
        break;
      }

      // If this is a newline continuation, skip it and all leading space.
      int c = *pos;
      if (c == '\n') {
        ++pos;
        while (pos != end && isspace(*pos))
          ++pos;
        continue;
      }

      // If this is single character escape, honor it.
      if (c == ' ' || c == ':' || c == '$') {
        result << char(c);
        ++pos;
        continue;
      }

      // If this is a braced variable reference, expand it.
      if (c == '{') {
        // Scan until the end of the reference, checking validity of the
        // identifier name as we go.
        ++pos;
        const char* varStart = pos;
        bool isValid = true;
        while (true) {
          // If we reached the end of the string, this is an error.
          if (pos == end) {
            error(
                "invalid variable reference in string (missing trailing '}')");
            break;
          }

          // If we found the end of the reference, resolve it.
          int c = *pos;
          if (c == '}') {
            // If this identifier isn't valid, emit an error.
            if (!isValid) {
              error("invalid variable name in reference");
            } else {
              lookup(userContext, StringRef(varStart, pos - varStart),
                     result);
            }
            ++pos;
            break;
          }

          // Track whether this is a valid identifier.
          if (!Lexer::isIdentifierChar(c))
            isValid = false;

          ++pos;
        }
        continue;
      }

      // If this is a simple variable reference, expand it.
      if (Lexer::isSimpleIdentifierChar(c)) {
        const char* varStart = pos;
        // Scan until the end of the simple identifier.
        ++pos;
        while (pos != end && Lexer::isSimpleIdentifierChar(*pos))
          ++pos;
        lookup(userContext, StringRef(varStart, pos-varStart), result);
        continue;
      }

      // Otherwise, we have an invalid '$' escape.
      error("invalid '$'-escape (literal '$' should be written as '$$')");
      break;
    }
  }